

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int name2id(name_map *map,int max,char *name)

{
  int iVar1;
  int local_2c;
  int i;
  char *name_local;
  int max_local;
  name_map *map_local;
  
  local_2c = 0;
  while( true ) {
    if (max <= local_2c) {
      return -1;
    }
    iVar1 = strcmp(map[local_2c].name,name);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  return map[local_2c].id;
}

Assistant:

int name2id(name_map* map, int max, const char *name)
{
	int i;

	for (i = 0; i < max; i++) {
		if (!strcmp(map[i].name, name)) {
			return map[i].id;
		}
	}

	// nothing match
	return -1;
}